

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::TensorViewNV::str_abi_cxx11_
          (string *__return_storage_ptr__,TensorViewNV *this)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  reference puVar4;
  const_iterator cStack_1a8;
  uint p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  ostringstream oss;
  TensorViewNV *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
  poVar3 = std::operator<<((ostream *)&__range2,"<");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)&(this->super_Type).field_0x24);
  poVar3 = std::operator<<(poVar3,", ");
  std::ostream::operator<<(poVar3,this->has_dimensions_id_);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->perm_);
  cStack_1a8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->perm_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe58);
    if (!bVar2) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    uVar1 = *puVar4;
    poVar3 = std::operator<<((ostream *)&__range2,", ");
    std::ostream::operator<<(poVar3,uVar1);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  std::operator<<((ostream *)&__range2,">");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::string TensorViewNV::str() const {
  std::ostringstream oss;
  oss << "<" << dim_id_ << ", " << has_dimensions_id_;
  for (auto p : perm_) {
    oss << ", " << p;
  }
  oss << ">";
  return oss.str();
}